

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

void __thiscall
Rml::ElementDocument::ProcessHeader(ElementDocument *this,DocumentHeader *document_header)

{
  byte *_buffer;
  size_t _buffer_size;
  Vector2f vp_dimensions;
  pointer pRVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  String *name;
  Template *this_00;
  DocumentHeader *header_00;
  StreamMemory *this_01;
  StyleSheetContainer *container;
  Vector2i VVar5;
  Resource *script;
  pointer pRVar6;
  _Head_base<0UL,_Rml::StyleSheet_*,_false> this_02;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar8;
  pointer pMVar9;
  float dp_ratio;
  float fVar10;
  float fVar11;
  SharedPtr<Rml::StyleSheetContainer> inline_sheet;
  UniquePtr<Rml::StreamMemory> stream;
  DocumentHeader header;
  pointer local_230;
  undefined1 local_228 [48];
  pointer local_1f8;
  undefined1 local_1f0 [64];
  StringList local_1b0;
  vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_> vStack_198;
  vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_> local_180;
  URL local_168;
  
  ::std::__cxx11::string::_M_assign((string *)&this->source_url);
  local_1f0._0_8_ = local_1f0 + 0x10;
  local_1f0._8_8_ = (pointer)0x0;
  local_1f0[0x10] = '\0';
  local_1f0._32_8_ = local_1f0 + 0x30;
  local_1f0._40_8_ = 0;
  local_1f0[0x30] = '\0';
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_198.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_198.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_198.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DocumentHeader::MergePaths
            ((DocumentHeader *)local_1f0,&local_1b0,&document_header->template_resources,
             &document_header->source);
  local_228._32_8_ = this;
  if (local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      URL::URL(&local_168,
               (String *)
               ((long)&((local_1b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
      name = URL::GetURL_abi_cxx11_(&local_168);
      this_00 = TemplateCache::LoadTemplate(name);
      URL::~URL(&local_168);
      if (this_00 == (Template *)0x0) {
        Log::Message(LT_WARNING,"Template %s not found",
                     *(undefined8 *)
                      ((long)&((local_1b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar8));
      }
      else {
        header_00 = Template::GetHeader(this_00);
        DocumentHeader::MergeHeader((DocumentHeader *)local_1f0,header_00);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar7 < (ulong)((long)local_1b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  DocumentHeader::MergeHeader((DocumentHeader *)local_1f0,document_header);
  ::std::__cxx11::string::_M_assign((string *)(local_228._32_8_ + 0x188));
  pRVar1 = vStack_198.
           super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (vStack_198.
      super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      vStack_198.
      super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_230 = (pointer)0x0;
    this_02._M_head_impl = (StyleSheet *)0x0;
  }
  else {
    this_02._M_head_impl = (StyleSheet *)0x0;
    local_230 = (pointer)0x0;
    pRVar6 = vStack_198.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pRVar6->is_inline == true) {
        local_228._0_8_ = (StyleSheet *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Rml::StyleSheetContainer,std::allocator<Rml::StyleSheetContainer>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8),
                   (StyleSheetContainer **)local_228,
                   (allocator<Rml::StyleSheetContainer> *)&local_168);
        _buffer = (byte *)(pRVar6->content)._M_dataplus._M_p;
        _buffer_size = (pRVar6->content)._M_string_length;
        this_01 = (StreamMemory *)operator_new(0x170);
        StreamMemory::StreamMemory(this_01,_buffer,_buffer_size);
        local_228._24_8_ = this_01;
        URL::URL(&local_168,&pRVar6->path);
        StreamMemory::SetSourceURL(this_01,&local_168);
        URL::~URL(&local_168);
        bVar4 = StyleSheetContainer::LoadStyleSheetContainer
                          ((StyleSheetContainer *)local_228._0_8_,(Stream *)local_228._24_8_,
                           pRVar6->line);
        uVar3 = local_228._8_8_;
        uVar2 = local_228._0_8_;
        pMVar9 = local_230;
        if (bVar4) {
          if (this_02._M_head_impl == (StyleSheet *)0x0) {
            local_228._0_8_ = (StyleSheet *)0x0;
            local_228._8_8_ = (pointer)0x0;
            this_02._M_head_impl = (StyleSheet *)uVar2;
            pMVar9 = (pointer)uVar3;
            if (local_230 != (pointer)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
            }
          }
          else {
            StyleSheetContainer::MergeStyleSheetContainer
                      ((StyleSheetContainer *)this_02._M_head_impl,
                       (StyleSheetContainer *)local_228._0_8_);
          }
        }
        uVar2 = local_228._24_8_;
        local_228._24_8_ = (pointer)0x0;
        if ((StreamMemory *)uVar2 != (StreamMemory *)0x0) {
          StreamMemory::~StreamMemory((StreamMemory *)uVar2);
          operator_delete((void *)uVar2,0x170);
        }
        ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
                  ((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                   (local_228 + 0x18));
        local_230 = pMVar9;
        if ((pointer)local_228._8_8_ != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
      }
      else {
        container = StyleSheetFactory::GetStyleSheetContainer(&pRVar6->path);
        if (container == (StyleSheetContainer *)0x0) {
          Log::Message(LT_ERROR,"Failed to load style sheet %s.",(pRVar6->path)._M_dataplus._M_p);
        }
        else if (this_02._M_head_impl == (StyleSheet *)0x0) {
          StyleSheetContainer::StyleSheetContainer((StyleSheetContainer *)&local_168);
          StyleSheetContainer::CombineStyleSheetContainer
                    ((StyleSheetContainer *)local_228,container);
          uVar2 = local_228._8_8_;
          this_02._M_head_impl = (StyleSheet *)local_228._0_8_;
          local_228._0_8_ = (StyleSheet *)0x0;
          local_228._8_8_ = (pointer)0x0;
          if (local_230 != (pointer)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
          }
          if ((pointer)local_228._8_8_ != (pointer)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          StyleSheetContainer::~StyleSheetContainer((StyleSheetContainer *)&local_168);
          local_230 = (pointer)uVar2;
        }
        else {
          StyleSheetContainer::MergeStyleSheetContainer
                    ((StyleSheetContainer *)this_02._M_head_impl,container);
        }
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  uVar2 = local_228._32_8_;
  pRVar6 = local_180.
           super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = local_180.
           super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Head_base<0UL,_Rml::StyleSheet_*,_false>)this_02._M_head_impl !=
      (_Head_base<0UL,_Rml::StyleSheet_*,_false>)0x0) {
    local_228._40_8_ = this_02._M_head_impl;
    local_1f8 = local_230;
    SetStyleSheetContainer
              ((ElementDocument *)local_228._32_8_,
               (SharedPtr<StyleSheetContainer> *)(local_228 + 0x28));
    if (local_1f8 != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8);
    }
    local_230 = (pointer)0x0;
    pRVar6 = local_180.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = local_180.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pRVar6 != pRVar1; pRVar6 = pRVar6 + 1) {
    if (pRVar6->is_inline == true) {
      (*(((Element *)uVar2)->super_ScriptInterface).super_Releasable._vptr_Releasable[0x18])
                (uVar2,&pRVar6->content,pRVar6,(ulong)(uint)pRVar6->line);
    }
    else {
      (*(((Element *)uVar2)->super_ScriptInterface).super_Releasable._vptr_Releasable[0x19])
                (uVar2,pRVar6);
    }
  }
  local_168.url._M_dataplus._M_p = (pointer)0x2d;
  Variant::Set((Variant *)&local_168,1);
  local_168.protocol._M_string_length = 0xffffffff00000001;
  local_168.protocol.field_2._M_allocated_capacity = 0;
  local_168.protocol.field_2._8_4_ = 0xffffffff;
  local_168.login._M_dataplus._M_p = (pointer)0x0;
  local_168.login._M_string_length = 0;
  Element::SetProperty((Element *)uVar2,Visibility,(Property *)&local_168);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.login._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.login._M_string_length);
  }
  Variant::~Variant((Variant *)&local_168);
  if (*(Context **)(uVar2 + 0x1d8) == (Context *)0x0) {
    dp_ratio = 1.0;
  }
  else {
    dp_ratio = Context::GetDensityIndependentPixelRatio(*(Context **)(uVar2 + 0x1d8));
  }
  if (*(Context **)(uVar2 + 0x1d8) == (Context *)0x0) {
    fVar11 = 1.0;
    fVar10 = 1.0;
  }
  else {
    VVar5 = Context::GetDimensions(*(Context **)(uVar2 + 0x1d8));
    fVar11 = (float)VVar5.x;
    fVar10 = (float)VVar5.y;
  }
  vp_dimensions.y = fVar10;
  vp_dimensions.x = fVar11;
  Element::UpdateProperties((Element *)uVar2,dp_ratio,vp_dimensions);
  if (local_230 != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
  }
  ::std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
  ~vector(&local_180);
  ::std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
  ~vector(&vStack_198);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b0);
  if ((undefined1 *)local_1f0._32_8_ != local_1f0 + 0x30) {
    operator_delete((void *)local_1f0._32_8_,CONCAT71(local_1f0._49_7_,local_1f0[0x30]) + 1);
  }
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
  }
  return;
}

Assistant:

void ElementDocument::ProcessHeader(const DocumentHeader* document_header)
{
	RMLUI_ZoneScoped;

	// Store the source address that we came from
	source_url = document_header->source;

	// Construct a new header and copy the template details across
	DocumentHeader header;
	header.MergePaths(header.template_resources, document_header->template_resources, document_header->source);

	// Merge in any templates, note a merge may cause more templates to merge
	for (size_t i = 0; i < header.template_resources.size(); i++)
	{
		Template* merge_template = TemplateCache::LoadTemplate(URL(header.template_resources[i]).GetURL());

		if (merge_template)
			header.MergeHeader(*merge_template->GetHeader());
		else
			Log::Message(Log::LT_WARNING, "Template %s not found", header.template_resources[i].c_str());
	}

	// Merge the document's header last, as it is the most overriding.
	header.MergeHeader(*document_header);

	// Set the title to the document title.
	title = document_header->title;

	// If a style-sheet (or sheets) has been specified for this element, then we load them and set the combined sheet
	// on the element; all of its children will inherit it by default.
	SharedPtr<StyleSheetContainer> new_style_sheet;

	// Combine any inline sheets.
	for (const DocumentHeader::Resource& rcss : header.rcss)
	{
		if (rcss.is_inline)
		{
			auto inline_sheet = MakeShared<StyleSheetContainer>();
			auto stream = MakeUnique<StreamMemory>((const byte*)rcss.content.c_str(), rcss.content.size());
			stream->SetSourceURL(rcss.path);

			if (inline_sheet->LoadStyleSheetContainer(stream.get(), rcss.line))
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*inline_sheet);
				else
					new_style_sheet = std::move(inline_sheet);
			}

			stream.reset();
		}
		else
		{
			const StyleSheetContainer* sub_sheet = StyleSheetFactory::GetStyleSheetContainer(rcss.path);
			if (sub_sheet)
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*sub_sheet);
				else
					new_style_sheet = sub_sheet->CombineStyleSheetContainer(StyleSheetContainer());
			}
			else
				Log::Message(Log::LT_ERROR, "Failed to load style sheet %s.", rcss.path.c_str());
		}
	}

	// If a style sheet is available, set it on the document.
	if (new_style_sheet)
		SetStyleSheetContainer(std::move(new_style_sheet));

	// Load scripts.
	for (const DocumentHeader::Resource& script : header.scripts)
	{
		if (script.is_inline)
		{
			LoadInlineScript(script.content, script.path, script.line);
		}
		else
		{
			LoadExternalScript(script.path);
		}
	}

	// Hide this document.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));

	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));

	// Update properties so that e.g. visibility status can be queried properly immediately.
	UpdateProperties(dp_ratio, vp_dimensions);
}